

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall cereal::JSONInputArchive::startNode(JSONInputArchive *this)

{
  GenericValue *pGVar1;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_20;
  
  search(this);
  pGVar1 = Iterator::value((this->itsIteratorStack).
                           super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((pGVar1->data_).f.flags == 4) {
    pGVar1 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_20.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::Begin(pGVar1);
    pGVar1 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(pGVar1);
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const*,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const*>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                **)&local_20,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                **)&local_28);
  }
  else {
    pGVar1 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_20.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberBegin(pGVar1);
    pGVar1 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(pGVar1);
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,&local_20,&local_28);
  }
  return;
}

Assistant:

void startNode()
      {
        search();

        if(itsIteratorStack.back().value().IsArray())
          itsIteratorStack.emplace_back(itsIteratorStack.back().value().Begin(), itsIteratorStack.back().value().End());
        else
          itsIteratorStack.emplace_back(itsIteratorStack.back().value().MemberBegin(), itsIteratorStack.back().value().MemberEnd());
      }